

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.h
# Opt level: O0

S2CellId __thiscall S2CellId::child(S2CellId *this,int position)

{
  bool bVar1;
  ostream *poVar2;
  uint64 uVar3;
  uint64 new_lsb;
  S2LogMessage local_58;
  S2LogMessageVoidify local_45 [20];
  byte local_31;
  S2LogMessage local_30;
  S2LogMessageVoidify local_1d;
  int local_1c;
  S2CellId *pSStack_18;
  int position_local;
  S2CellId *this_local;
  
  local_1c = position;
  pSStack_18 = this;
  bVar1 = is_valid(this);
  local_31 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
               ,0x271,kFatal,(ostream *)&std::cerr);
    local_31 = 1;
    poVar2 = S2LogMessage::stream(&local_30);
    poVar2 = std::operator<<(poVar2,"Check failed: is_valid() ");
    S2LogMessageVoidify::operator&(&local_1d,poVar2);
  }
  if ((local_31 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
  }
  bVar1 = is_leaf(this);
  if (bVar1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
               ,0x272,kFatal,(ostream *)&std::cerr);
    poVar2 = S2LogMessage::stream(&local_58);
    poVar2 = std::operator<<(poVar2,"Check failed: !is_leaf() ");
    S2LogMessageVoidify::operator&(local_45,poVar2);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_58);
  }
  uVar3 = lsb(this);
  S2CellId((S2CellId *)&this_local,this->id_ + (long)(local_1c * 2 + -3) * (uVar3 >> 2));
  return (S2CellId)(uint64)this_local;
}

Assistant:

inline S2CellId S2CellId::child(int position) const {
  S2_DCHECK(is_valid());
  S2_DCHECK(!is_leaf());
  // To change the level, we need to move the least-significant bit two
  // positions downward.  We do this by subtracting (4 * new_lsb) and adding
  // new_lsb.  Then to advance to the given child cell, we add
  // (2 * position * new_lsb).
  uint64 new_lsb = lsb() >> 2;
  return S2CellId(id_ + (2 * position + 1 - 4) * new_lsb);
}